

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.h
# Opt level: O2

void __thiscall snmalloc::LocalEntropy::make_free_list_key(LocalEntropy *this,FreeListKey *key)

{
  uint64_t uVar1;
  
  uVar1 = get_next(this);
  key->key1 = uVar1;
  uVar1 = get_next(this);
  key->key2 = uVar1;
  uVar1 = get_next(this);
  key->key_next = uVar1;
  return;
}

Assistant:

void make_free_list_key(FreeListKey& key)
    {
      if constexpr (bits::BITS == 64)
      {
        key.key1 = static_cast<address_t>(get_next());
        key.key2 = static_cast<address_t>(get_next());
        key.key_next = static_cast<address_t>(get_next());
      }
      else
      {
        key.key1 = static_cast<address_t>(get_next() & 0xffff'ffff);
        key.key2 = static_cast<address_t>(get_next() & 0xffff'ffff);
        key.key_next = static_cast<address_t>(get_next() & 0xffff'ffff);
      }
    }